

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O2

void xmrig::OclCache::save(cl_program program,string *fileName)

{
  cl_int cVar1;
  size_t size;
  vector<char,_std::allocator<char>_> binary;
  char *data;
  ofstream file_stream;
  
  size = 0;
  cVar1 = OclLib::getProgramInfo(program,0x1165,8,&size,(size_t *)0x0);
  if (cVar1 == 0) {
    std::vector<char,_std::allocator<char>_>::vector(&binary,size,(allocator_type *)&file_stream);
    data = binary.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
    cVar1 = OclLib::getProgramInfo(program,0x1166,8,&data,(size_t *)0x0);
    if (cVar1 == 0) {
      createDirectory();
      std::ofstream::ofstream(&file_stream);
      std::ofstream::open((string *)&file_stream,(_Ios_Openmode)fileName);
      std::ostream::write((char *)&file_stream,
                          (long)binary.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      std::ofstream::close();
      std::ofstream::~ofstream(&file_stream);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&binary.super__Vector_base<char,_std::allocator<char>_>);
  }
  return;
}

Assistant:

void xmrig::OclCache::save(cl_program program, const std::string &fileName)
{
    size_t size = 0;
    if (OclLib::getProgramInfo(program, CL_PROGRAM_BINARY_SIZES, sizeof(size), &size) != CL_SUCCESS) {
        return;
    }

    std::vector<char> binary(size);

    char *data = binary.data();
    if (OclLib::getProgramInfo(program, CL_PROGRAM_BINARIES, sizeof(char *), &data) != CL_SUCCESS) {
        return;
    }

    createDirectory();

    std::ofstream file_stream;
    file_stream.open(fileName, std::ofstream::out | std::ofstream::binary);
    file_stream.write(binary.data(), static_cast<int64_t>(binary.size()));
    file_stream.close();
}